

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

int copyEntityTable(HASH_TABLE *newTable,STRING_POOL *newPool,HASH_TABLE *oldTable,XML_Parser parser
                   )

{
  XML_Char XVar1;
  bool bVar2;
  int iVar3;
  XML_Char *pXVar4;
  NAMED *pNVar5;
  KEY pXVar6;
  KEY pXVar7;
  XML_Char *pXVar8;
  NAMED **ppNVar9;
  int iVar10;
  NAMED **ppNVar11;
  NAMED *pNVar12;
  char cVar13;
  
  ppNVar11 = oldTable->v;
  ppNVar9 = ppNVar11 + oldTable->size;
  pXVar7 = (KEY)0x0;
  pXVar8 = (XML_Char *)0x0;
LAB_004cd485:
  do {
    if (ppNVar11 == ppNVar9) {
      pNVar12 = (NAMED *)0x0;
    }
    else {
      pNVar12 = *ppNVar11;
      ppNVar11 = ppNVar11 + 1;
      if (pNVar12 == (NAMED *)0x0) goto LAB_004cd485;
    }
    if (pNVar12 == (NAMED *)0x0) {
      cVar13 = '\x02';
    }
    else {
      pXVar4 = poolCopyString(newPool,pNVar12->name);
      cVar13 = '\x01';
      if ((pXVar4 == (XML_Char *)0x0) ||
         (pNVar5 = lookup(newTable,pXVar4,0x40), pNVar5 == (NAMED *)0x0)) {
        cVar13 = '\x01';
      }
      else if (pNVar12[3].name == (XML_Char *)0x0) {
        pXVar6 = pNVar12[1].name;
        iVar10 = *(int *)&pNVar12[2].name;
        if ((newPool->ptr == (XML_Char *)0x0) && (iVar3 = poolGrow(newPool), iVar3 == 0)) {
LAB_004cd5fa:
          pXVar6 = (KEY)0x0;
        }
        else {
          if (0 < iVar10) {
            iVar10 = iVar10 + 1;
            do {
              if ((newPool->ptr == newPool->end) && (iVar3 = poolGrow(newPool), iVar3 == 0))
              goto LAB_004cd5fa;
              XVar1 = *pXVar6;
              pXVar4 = newPool->ptr;
              newPool->ptr = pXVar4 + 1;
              *pXVar4 = XVar1;
              pXVar6 = pXVar6 + 1;
              iVar10 = iVar10 + -1;
            } while (1 < iVar10);
          }
          pXVar6 = newPool->start;
          newPool->start = newPool->ptr;
        }
        if (pXVar6 != (KEY)0x0) {
          pNVar5[1].name = pXVar6;
          *(undefined4 *)&pNVar5[2].name = *(undefined4 *)&pNVar12[2].name;
          goto LAB_004cd620;
        }
        cVar13 = '\x01';
      }
      else {
        pXVar4 = poolCopyString(newPool,pNVar12[3].name);
        if (pXVar4 == (XML_Char *)0x0) {
          bVar2 = false;
        }
        else {
          pNVar5[3].name = pXVar4;
          pXVar4 = pNVar12[4].name;
          if (pXVar4 != (XML_Char *)0x0) {
            pXVar6 = pXVar7;
            if ((pXVar4 != pXVar8) &&
               (pXVar6 = poolCopyString(newPool,pXVar4), pXVar8 = pXVar4, pXVar6 == (XML_Char *)0x0)
               ) {
              bVar2 = false;
              goto LAB_004cd5ef;
            }
            pNVar5[4].name = pXVar6;
            pXVar7 = pXVar6;
          }
          bVar2 = true;
        }
LAB_004cd5ef:
        if (bVar2) {
LAB_004cd620:
          cVar13 = '\0';
          if (pNVar12[6].name != (XML_Char *)0x0) {
            pXVar4 = poolCopyString(newPool,pNVar12[6].name);
            cVar13 = pXVar4 == (XML_Char *)0x0;
            if (!(bool)cVar13) {
              pNVar5[6].name = pXVar4;
            }
          }
        }
      }
    }
    if (cVar13 != '\0') {
      return (uint)(cVar13 == '\x02');
    }
  } while( true );
}

Assistant:

static int copyEntityTable(HASH_TABLE *newTable,
                           STRING_POOL *newPool,
                           const HASH_TABLE *oldTable,
                           XML_Parser parser)
{
  HASH_TABLE_ITER iter;
  const XML_Char *cachedOldBase = 0;
  const XML_Char *cachedNewBase = 0;
  cmExpatUnused(parser);

  hashTableIterInit(&iter, oldTable);

  for (;;) {
    ENTITY *newE;
    const XML_Char *name;
    const ENTITY *oldE = (ENTITY *)hashTableIterNext(&iter);
    if (!oldE)
      break;
    name = poolCopyString(newPool, oldE->name);
    if (!name)
      return 0;
    newE = (ENTITY *)lookup(newTable, name, sizeof(ENTITY));
    if (!newE)
      return 0;
    if (oldE->systemId) {
      const XML_Char *tem = poolCopyString(newPool, oldE->systemId);
      if (!tem)
        return 0;
      newE->systemId = tem;
      if (oldE->base) {
        if (oldE->base == cachedOldBase)
          newE->base = cachedNewBase;
        else {
          cachedOldBase = oldE->base;
          tem = poolCopyString(newPool, cachedOldBase);
          if (!tem)
            return 0;
          cachedNewBase = newE->base = tem;
        }
      }
    }
    else {
      const XML_Char *tem = poolCopyStringN(newPool, oldE->textPtr, oldE->textLen);
      if (!tem)
        return 0;
      newE->textPtr = tem;
      newE->textLen = oldE->textLen;
    }
    if (oldE->notation) {
      const XML_Char *tem = poolCopyString(newPool, oldE->notation);
      if (!tem)
        return 0;
      newE->notation = tem;
    }
  }
  return 1;
}